

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inlining.cpp
# Opt level: O0

void __thiscall wasm::InlineMainPass::run(InlineMainPass *this,Module *module)

{
  Function *into;
  Function *module_00;
  bool bVar1;
  Function *pFVar2;
  reference pppEVar3;
  Call *pCVar4;
  PassOptions *options;
  InliningAction local_b8;
  undefined4 local_a8;
  IString local_98;
  vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *local_88;
  Expression **call;
  iterator __end2;
  iterator __begin2;
  vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *__range2;
  Expression **callSite;
  FindAllPointers<wasm::Call> calls;
  Function *originalMain;
  Function *local_20;
  Function *main;
  Module *module_local;
  InlineMainPass *this_local;
  
  main = (Function *)module;
  module_local = (Module *)this;
  wasm::Name::Name((Name *)&originalMain,MAIN);
  local_20 = Module::getFunctionOrNull(module,(Name)_originalMain);
  pFVar2 = main;
  wasm::Name::Name((Name *)&calls.list.
                            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,ORIGINAL_MAIN);
  pFVar2 = Module::getFunctionOrNull((Module *)pFVar2,(Name)stack0xffffffffffffffb8);
  if ((((local_20 != (Function *)0x0) &&
       (bVar1 = Importable::imported(&local_20->super_Importable), !bVar1)) &&
      (pFVar2 != (Function *)0x0)) &&
     (bVar1 = Importable::imported(&pFVar2->super_Importable), !bVar1)) {
    FindAllPointers<wasm::Call>::FindAllPointers
              ((FindAllPointers<wasm::Call> *)&callSite,&local_20->body);
    __range2 = (vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *)0x0;
    __end2 = std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::begin
                       ((vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *)
                        &callSite);
    call = (Expression **)
           std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::end
                     ((vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *)&callSite
                     );
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<wasm::Expression_***,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>
                                       *)&call), module_00 = main, into = local_20, bVar1) {
      pppEVar3 = __gnu_cxx::
                 __normal_iterator<wasm::Expression_***,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>
                 ::operator*(&__end2);
      local_88 = (vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *)*pppEVar3;
      pCVar4 = Expression::cast<wasm::Call>
                         ((Expression *)
                          (local_88->
                          super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                          )._M_impl.super__Vector_impl_data._M_start);
      IString::IString(&local_98,ORIGINAL_MAIN);
      bVar1 = IString::operator==(&(pCVar4->target).super_IString,&local_98);
      if (bVar1) {
        if (__range2 != (vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *)0x0) {
          local_a8 = 1;
          goto LAB_017946ab;
        }
        __range2 = local_88;
      }
      __gnu_cxx::
      __normal_iterator<wasm::Expression_***,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>
      ::operator++(&__end2);
    }
    if (__range2 == (vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *)0x0) {
      local_a8 = 1;
    }
    else {
      anon_unknown_225::InliningAction::InliningAction(&local_b8,(Expression **)__range2,pFVar2);
      options = Pass::getPassOptions(&this->super_Pass);
      anon_unknown_225::doInlining((Module *)module_00,into,&local_b8,options);
      local_a8 = 0;
    }
LAB_017946ab:
    FindAllPointers<wasm::Call>::~FindAllPointers((FindAllPointers<wasm::Call> *)&callSite);
  }
  return;
}

Assistant:

void run(Module* module) override {
    auto* main = module->getFunctionOrNull(MAIN);
    auto* originalMain = module->getFunctionOrNull(ORIGINAL_MAIN);
    if (!main || main->imported() || !originalMain ||
        originalMain->imported()) {
      return;
    }
    FindAllPointers<Call> calls(main->body);
    Expression** callSite = nullptr;
    for (auto* call : calls.list) {
      if ((*call)->cast<Call>()->target == ORIGINAL_MAIN) {
        if (callSite) {
          // More than one call site.
          return;
        }
        callSite = call;
      }
    }
    if (!callSite) {
      // No call at all.
      return;
    }
    doInlining(
      module, main, InliningAction(callSite, originalMain), getPassOptions());
  }